

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateRegistrationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  string local_48;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableExtensionGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"registry.add($scope$.$name$);\n");
  UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_48,(java *)this->descriptor_,field);
  protobuf::io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,local_28,(char (*) [6])0x2032b53,&this->scope_,(char (*) [5])0x1d1c66d,
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return 7;
}

Assistant:

int ImmutableExtensionGenerator::GenerateRegistrationCode(
    io::Printer* printer) {
  printer->Print("registry.add($scope$.$name$);\n", "scope", scope_, "name",
                 UnderscoresToCamelCaseCheckReserved(descriptor_));
  return 7;
}